

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helper.cpp
# Opt level: O2

bool SHOPManagement::Helper::saveFileByLine
               (string *file_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *t_data)

{
  int iVar1;
  pointer pbVar2;
  char cVar3;
  ostream *poVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> line;
  ofstream file_data;
  int aiStack_200 [120];
  
  std::ofstream::ofstream(&file_data,(string *)file_path,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    pbVar2 = (t_data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (t_data->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::string((string *)&line,(string *)pbVar5);
      std::operator<<((ostream *)&file_data,(string *)&line);
      std::endl<char,std::char_traits<char>>((ostream *)&file_data);
      std::__cxx11::string::~string((string *)&line);
    }
    std::ofstream::close();
    iVar1 = *(int *)((long)aiStack_200 + *(long *)(_file_data + -0x18));
    std::ofstream::~ofstream(&file_data);
    return iVar1 == 0;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,(string *)file_path);
  std::operator<<(poVar4," can\'t open!");
  exit(1);
}

Assistant:

bool Helper::saveFileByLine(const std::string &file_path, const std::vector<std::string> &t_data)
    {
        std::ofstream file_data(file_path);

        if (!file_data.is_open())
        {
            std::cerr << file_path << " can't open!";
            exit(EXIT_FAILURE);
        }

        for (auto line : t_data)
        {
            file_data << line;
            file_data << std::endl;
        }

        file_data.close();
        return file_data.good();
    }